

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparse.c
# Opt level: O3

void print_value(MOJOSHADER_effectValue *value,uint indent)

{
  MOJOSHADER_effectSamplerState *pMVar1;
  float *pfVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar4 = indent;
  if (indent != 0) {
    do {
      printf("    ");
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  printf("VALUE: %s -> %s\n",value->name,value->semantic);
  iVar5 = indent + 1;
  do {
    printf("    ");
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  printf("CLASS: %s\n",
         print_value_classes_rel +
         *(int *)(print_value_classes_rel + (ulong)(value->type).parameter_class * 4));
  iVar5 = indent + 1;
  do {
    printf("    ");
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  printf("TYPE: %s\n",print_value::types[(value->type).parameter_type]);
  iVar5 = indent + 1;
  do {
    printf("    ");
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  printf("ROWS/COLUMNS/ELEMENTS: %d, %d, %d\n",(ulong)(value->type).rows,
         (ulong)(value->type).columns,(ulong)(value->type).elements);
  iVar5 = indent + 1;
  do {
    printf("    ");
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  printf("TOTAL VALUES: %d\n",(ulong)value->value_count);
  if ((value->type).parameter_type - MOJOSHADER_SYMTYPE_SAMPLER < 5) {
    iVar5 = indent + 1;
    do {
      printf("    ");
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    puts("SAMPLER VALUES:");
    if (value->value_count != 0) {
      uVar8 = 0;
      do {
        pMVar1 = (value->field_4).valuesSS;
        iVar5 = indent + 2;
        do {
          printf("    ");
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        printf("TYPE: %s -> ",
               print_value_samplerstatetypes_rel +
               *(int *)(print_value_samplerstatetypes_rel + (ulong)pMVar1[uVar8].type * 4));
        pfVar2 = pMVar1[uVar8].value.field_4.valuesF;
        if (pMVar1[uVar8].type == MOJOSHADER_SAMP_MIPMAPLODBIAS) {
          printf("%.2f\n",(double)*pfVar2);
        }
        else {
          printf("%d\n",(ulong)(uint)*pfVar2);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < value->value_count);
    }
  }
  else {
    iVar5 = indent + 1;
    do {
      printf("    ");
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    printf("%s VALUES:\n",print_value::types[(value->type).parameter_type]);
    uVar4 = (value->type).rows;
    uVar7 = 0;
    do {
      bVar9 = uVar4 != 0;
      uVar4 = 0;
      if (bVar9) {
        uVar6 = 0;
        iVar5 = indent + 2;
        do {
          do {
            printf("    ");
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          if ((value->type).columns != 0) {
            uVar4 = 0;
            do {
              uVar8 = (ulong)(value->type).parameter_type;
              lVar3 = (long)(int)(uVar4 + ((value->type).rows * uVar7 + uVar6) * 4);
              if (uVar8 == 3) {
                printf("%.2f ",(double)*(float *)((long)(value->field_4).values + lVar3 * 4));
              }
              else {
                printf(print_value_prints_rel + *(int *)(print_value_prints_rel + uVar8 * 4),
                       (ulong)*(uint *)((long)(value->field_4).values + lVar3 * 4));
              }
              uVar4 = uVar4 + 1;
            } while (uVar4 < (value->type).columns);
          }
          putchar(10);
          uVar6 = uVar6 + 1;
          uVar4 = (value->type).rows;
          iVar5 = indent + 2;
        } while (uVar6 < uVar4);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (value->type).elements);
  }
  return;
}

Assistant:

static void print_value(const MOJOSHADER_effectValue *value,
                        const unsigned int indent)
{
    int i, r, c;

    INDENT();
    printf("VALUE: %s -> %s\n", value->name, value->semantic);

    static const char *classes[] =
    {
        "SCALAR",
        "VECTOR",
        "ROW-MAJOR MATRIX",
        "COLUMN-MAJOR MATRIX",
        "OBJECT",
        "STRUCT"
    };
    static const char *types[] =
    {
        "VOID",
        "BOOL",
        "INT",
        "FLOAT",
        "STRING",
        "TEXTURE",
        "TEXTURE1D",
        "TEXTURE2D",
        "TEXTURE3D",
        "TEXTURECUBE",
        "SAMPLER",
        "SAMPLER1D",
        "SAMPLER2D",
        "SAMPLER3D",
        "SAMPLERCUBE",
        "PIXELSHADER",
        "VERTEXSHADER",
        "UNSUPPORTED"
    };
    do_indent(indent + 1);
    printf("CLASS: %s\n", classes[value->type.parameter_class]);
    do_indent(indent + 1);
    printf("TYPE: %s\n", types[value->type.parameter_type]);

    do_indent(indent + 1);
    printf("ROWS/COLUMNS/ELEMENTS: %d, %d, %d\n",
           value->type.rows, value->type.columns, value->type.elements);
    do_indent(indent + 1);
    printf("TOTAL VALUES: %d\n", value->value_count);

    if (value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER1D
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER2D
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER3D
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
    {
        do_indent(indent + 1);
        printf("SAMPLER VALUES:\n");
        for (i = 0; i < value->value_count; i++)
        {
            MOJOSHADER_effectSamplerState *state = &value->valuesSS[i];

            static const char *samplerstatetypes[] =
            {
                "UNKNOWN0",
                "UNKNOWN1",
                "UNKNOWN2",
                "UNKNOWN3",
                "TEXTURE",
                "ADDRESSU",
                "ADDRESSV",
                "ADDRESSW",
                "BORDERCOLOR",
                "MAGFILTER",
                "MINFILTER",
                "MIPFILTER",
                "MIPMAPLODBIAS",
                "MAXMIPLEVEL",
                "MAXANISOTROPY",
                "SRGBTEXTURE",
                "ELEMENTINDEX",
                "DMAPOFFSET",
            };
            do_indent(indent + 2);
            printf("TYPE: %s -> ", samplerstatetypes[state->type]);

            /* Assuming only one value per state! */
            if (state->type == MOJOSHADER_SAMP_MIPMAPLODBIAS)
            {
                /* float types */
                printf("%.2f\n", *state->value.valuesF);
            } // if
            else
            {
                /* int/enum types */
                printf("%d\n", *state->value.valuesI);
            } // else
        } // for
    } // if
    else
    {
        do_indent(indent + 1);
        printf("%s VALUES:\n", types[value->type.parameter_type]);
        i = 0;
        do
        {
            static const char *prints[] =
            {
                "%X ",
                "%d ",
                "%d ",
                "%.2f ",
                "%d ",
                "%d ",
                "%d ",
                "%d ",
                "%d ",
                "%d ",
                "SAMPLER?! ",
                "SAMPLER?! ",
                "SAMPLER?! ",
                "SAMPLER?! ",
                "SAMPLER?! ",
                "%d ",
                "%d ",
                "%X "
            };
            for (r = 0; r < value->type.rows; r++)
            {
                do_indent(indent + 2);
                for (c = 0; c < value->type.columns; c++)
                {
                    const int offset = (i * value->type.rows * 4) + (r * 4) + c;
                    if (value->type.parameter_type == MOJOSHADER_SYMTYPE_FLOAT)
                        printf(prints[value->type.parameter_type], value->valuesF[offset]);
                    else
                        printf(prints[value->type.parameter_type], value->valuesI[offset]);
                } // for
                printf("\n");
            } // for
        } while (++i < value->type.elements);
    } // else
}